

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

UBool utrie_set32_63(UNewTrie *trie,UChar32 c,uint32_t value)

{
  UBool UVar1;
  int32_t iVar2;
  
  if (trie != (UNewTrie *)0x0) {
    UVar1 = '\0';
    if (((uint)c < 0x110000) && (UVar1 = '\0', trie->isCompacted == '\0')) {
      iVar2 = utrie_getDataBlock(trie,c);
      if (iVar2 < 0) {
        UVar1 = '\0';
      }
      else {
        trie->data[iVar2 + (c & 0x1fU)] = value;
        UVar1 = '\x01';
      }
    }
    return UVar1;
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
utrie_set32(UNewTrie *trie, UChar32 c, uint32_t value) {
    int32_t block;

    /* valid, uncompacted trie and valid c? */
    if(trie==NULL || trie->isCompacted || (uint32_t)c>0x10ffff) {
        return FALSE;
    }

    block=utrie_getDataBlock(trie, c);
    if(block<0) {
        return FALSE;
    }

    trie->data[block+(c&UTRIE_MASK)]=value;
    return TRUE;
}